

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

DWORD ResumeThread(HANDLE hThread)

{
  DWORD local_24;
  CPalThread *pCStack_20;
  DWORD dwSuspendCount;
  CPalThread *pthrResumer;
  HANDLE pVStack_10;
  PAL_ERROR palError;
  HANDLE hThread_local;
  
  local_24 = 0xffffffff;
  pVStack_10 = hThread;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_20 = CorUnix::InternalGetCurrentThread();
  pthrResumer._4_4_ = CorUnix::InternalResumeThread(pCStack_20,pVStack_10,&local_24);
  if (pthrResumer._4_4_ == 0) {
    if (local_24 == 0xffffffff) {
      fprintf(_stderr,"] %s %s:%d","ResumeThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
              ,0xa5);
      fprintf(_stderr,
              "Expression: dwSuspendCount != static_cast<DWORD>(-1), Description: InternalResumeThread returned success but dwSuspendCount did not change.\n"
             );
    }
  }
  else {
    CorUnix::CPalThread::SetLastError(pthrResumer._4_4_);
    local_24 = 0xffffffff;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_24;
  }
  abort();
}

Assistant:

DWORD
PALAPI
ResumeThread(
         IN HANDLE hThread
         )
{
    PAL_ERROR palError;
    CPalThread *pthrResumer;
    DWORD dwSuspendCount = (DWORD)-1;

    PERF_ENTRY(ResumeThread);
    ENTRY("ResumeThread(hThread=%p)\n", hThread);

    pthrResumer = InternalGetCurrentThread();
    palError = InternalResumeThread(
        pthrResumer,
        hThread,
        &dwSuspendCount
        );

    if (NO_ERROR != palError)
    {
        pthrResumer->SetLastError(palError);
        dwSuspendCount = (DWORD) -1;
    }
    else
    {
        _ASSERT_MSG(dwSuspendCount != static_cast<DWORD>(-1), "InternalResumeThread returned success but dwSuspendCount did not change.\n");
    }

    LOGEXIT("ResumeThread returns DWORD %u\n", dwSuspendCount);
    PERF_EXIT(ResumeThread);
    return dwSuspendCount;
}